

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOutReference_GetSerializeSize_Test::~ConfidentialTxOutReference_GetSerializeSize_Test
          (ConfidentialTxOutReference_GetSerializeSize_Test *this)

{
  ConfidentialTxOutReference_GetSerializeSize_Test *this_local;
  
  ~ConfidentialTxOutReference_GetSerializeSize_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTxOutReference, GetSerializeSize) {
  {
    int64_t satoshi = 1000000;
    ConfidentialAssetId asset("1234567890123456789012345678901234567890123456789012345678901234");
    ConfidentialTxOut txout(exp_script, asset,
        ConfidentialValue(Amount::CreateBySatoshiAmount(satoshi)));
    ConfidentialTxOutReference txout_ref(txout);

    uint32_t wit_size = 0;
    uint32_t no_wit_size = 0;
    EXPECT_EQ(txout_ref.GetSerializeSize(false, &wit_size, &no_wit_size), 68);
    EXPECT_EQ(wit_size, 2);
    EXPECT_EQ(no_wit_size, 66);

    uint32_t cache_size = 0;
    wit_size = 0;
    no_wit_size = 0;
    int exponent = 0;
    int minimum_bits = 36;
    EXPECT_EQ(3177,
        txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size));
    EXPECT_EQ(3055, wit_size);
    EXPECT_EQ(122, no_wit_size);
    EXPECT_EQ(2892, cache_size);

    minimum_bits = 52;
    cache_size = 0;
    EXPECT_EQ(4458,
        txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size, 256));
    EXPECT_EQ(4336, wit_size);
    EXPECT_EQ(122, no_wit_size);
    EXPECT_EQ(4173, cache_size);

    minimum_bits = 52;
    cache_size = 0;
    EXPECT_EQ(4395,
        txout_ref.GetSerializeSize(true, &wit_size, &no_wit_size, exponent, minimum_bits, &cache_size, 2));
    EXPECT_EQ(4273, wit_size);
    EXPECT_EQ(122, no_wit_size);
    EXPECT_EQ(4173, cache_size);
  }
}